

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

qpdf_oh qpdf_get_page_n(qpdf_data qpdf,size_t i)

{
  uint uVar1;
  qpdf_oh result;
  qpdf_oh local_34;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._M_unused._M_object = &local_34;
  local_34 = 0;
  local_18 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1823:15)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1823:15)>
             ::_M_manager;
  local_30._8_8_ = i;
  uVar1 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  if (local_34 == 0 || 1 < uVar1) {
    local_34 = qpdf_oh_new_uninitialized(qpdf);
  }
  return local_34;
}

Assistant:

qpdf_oh
qpdf_get_page_n(qpdf_data qpdf, size_t i)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_get_page_n");
    qpdf_oh result = 0;
    QPDF_ERROR_CODE code = trap_errors(
        qpdf, [&result, i](qpdf_data q) { result = new_object(q, q->qpdf->getAllPages().at(i)); });
    if ((code & QPDF_ERRORS) || (result == 0)) {
        return qpdf_oh_new_uninitialized(qpdf);
    }
    return result;
}